

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void fchown_cb(uv_fs_t *req)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  uv_buf_t uVar6;
  undefined1 auStack_3b0 [88];
  long lStack_358;
  long lStack_350;
  code *pcStack_1f8;
  code *pcStack_1f0;
  undefined8 uStack_1e8;
  char acStack_1d8 [88];
  char *pcStack_180;
  
  if (req->fs_type == UV_FS_FCHOWN) {
    if (req->result == 0) {
      fchown_cb_count = fchown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    fchown_cb_cold_1();
  }
  fchown_cb_cold_2();
  if (req->fs_type == UV_FS_LCHOWN) {
    if (req->result == 0) {
      lchown_cb_count = lchown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    lchown_cb_cold_1();
  }
  lchown_cb_cold_2();
  pcVar3 = "test_file";
  pcStack_1f0 = (code *)0x155949;
  unlink("test_file");
  pcStack_1f0 = (code *)0x155955;
  unlink("test_file_link");
  pcStack_1f0 = (code *)0x155961;
  unlink("test_file_link2");
  pcStack_1f0 = (code *)0x155966;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar5 = (char *)0x0;
  pcStack_1f0 = (code *)0x15598a;
  iVar1 = uv_fs_open(0,acStack_1d8,"test_file",0x42,0x180,0);
  pcVar4 = pcStack_180;
  if (iVar1 < 0) {
    pcStack_1f0 = (code *)0x155cc8;
    run_test_fs_link_cold_1();
LAB_00155cc8:
    pcStack_1f0 = (code *)0x155ccd;
    run_test_fs_link_cold_2();
LAB_00155ccd:
    pcStack_1f0 = (code *)0x155cd2;
    run_test_fs_link_cold_3();
LAB_00155cd2:
    pcStack_1f0 = (code *)0x155cd7;
    run_test_fs_link_cold_4();
LAB_00155cd7:
    pcStack_1f0 = (code *)0x155cdc;
    run_test_fs_link_cold_5();
LAB_00155cdc:
    pcStack_1f0 = (code *)0x155ce1;
    run_test_fs_link_cold_6();
LAB_00155ce1:
    pcVar4 = pcVar3;
    pcStack_1f0 = (code *)0x155ce6;
    run_test_fs_link_cold_7();
LAB_00155ce6:
    pcStack_1f0 = (code *)0x155ceb;
    run_test_fs_link_cold_8();
LAB_00155ceb:
    pcStack_1f0 = (code *)0x155cf0;
    run_test_fs_link_cold_9();
LAB_00155cf0:
    pcStack_1f0 = (code *)0x155cf5;
    run_test_fs_link_cold_10();
LAB_00155cf5:
    pcStack_1f0 = (code *)0x155cfa;
    run_test_fs_link_cold_11();
LAB_00155cfa:
    pcStack_1f0 = (code *)0x155cff;
    run_test_fs_link_cold_12();
LAB_00155cff:
    pcStack_1f0 = (code *)0x155d04;
    run_test_fs_link_cold_13();
LAB_00155d04:
    pcVar3 = pcVar4;
    pcStack_1f0 = (code *)0x155d09;
    run_test_fs_link_cold_14();
LAB_00155d09:
    pcStack_1f0 = (code *)0x155d0e;
    run_test_fs_link_cold_15();
LAB_00155d0e:
    pcStack_1f0 = (code *)0x155d13;
    run_test_fs_link_cold_16();
LAB_00155d13:
    pcStack_1f0 = (code *)0x155d18;
    run_test_fs_link_cold_17();
LAB_00155d18:
    pcStack_1f0 = (code *)0x155d1d;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar3 = pcStack_180;
    if ((long)pcStack_180 < 0) goto LAB_00155cc8;
    pcStack_1f0 = (code *)0x1559ad;
    uv_fs_req_cleanup(acStack_1d8);
    pcStack_1f0 = (code *)0x1559be;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_1e8 = 0;
    pcVar5 = (char *)0x0;
    pcStack_1f0 = (code *)0x1559f4;
    iVar1 = uv_fs_write(0,acStack_1d8,(ulong)pcVar4 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar3 = pcVar4;
    if (iVar1 != 0xd) goto LAB_00155ccd;
    if (pcStack_180 != (char *)0xd) goto LAB_00155cd2;
    pcStack_1f0 = (code *)0x155a16;
    uv_fs_req_cleanup(acStack_1d8);
    pcStack_1f0 = (code *)0x155a29;
    uv_fs_close(loop,acStack_1d8,(ulong)pcVar4 & 0xffffffff,0);
    pcVar5 = (char *)0x0;
    pcStack_1f0 = (code *)0x155a44;
    iVar1 = uv_fs_link(0,acStack_1d8,"test_file","test_file_link",0);
    if (iVar1 != 0) goto LAB_00155cd7;
    if (pcStack_180 != (char *)0x0) goto LAB_00155cdc;
    pcStack_1f0 = (code *)0x155a65;
    uv_fs_req_cleanup();
    pcVar5 = (char *)0x0;
    pcStack_1f0 = (code *)0x155a81;
    iVar1 = uv_fs_open(0,acStack_1d8,"test_file_link",2,0,0);
    pcVar4 = pcStack_180;
    pcVar3 = acStack_1d8;
    if (iVar1 < 0) goto LAB_00155ce1;
    if ((long)pcStack_180 < 0) goto LAB_00155ce6;
    pcStack_1f0 = (code *)0x155aa4;
    uv_fs_req_cleanup(acStack_1d8);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_1f0 = (code *)0x155ac6;
    uVar6 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_1e8 = 0;
    pcVar5 = (char *)0x0;
    pcStack_1f0 = (code *)0x155af8;
    iov = uVar6;
    iVar1 = uv_fs_read(0,acStack_1d8,(ulong)pcVar4 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155ceb;
    if ((long)pcStack_180 < 0) goto LAB_00155cf0;
    pcVar5 = buf;
    pcStack_1f0 = (code *)0x155b1f;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155cf5;
    pcStack_1f0 = (code *)0x155b2e;
    close((int)pcVar4);
    pcStack_1f0 = (code *)0x155b54;
    pcVar5 = (char *)loop;
    iVar1 = uv_fs_link(loop,acStack_1d8,"test_file","test_file_link2",link_cb);
    if (iVar1 != 0) goto LAB_00155cfa;
    pcStack_1f0 = (code *)0x155b6a;
    pcVar5 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_00155cff;
    pcVar5 = (char *)0x0;
    pcStack_1f0 = (code *)0x155b95;
    iVar1 = uv_fs_open(0,acStack_1d8,"test_file_link2",2,0,0);
    pcVar3 = pcStack_180;
    if (iVar1 < 0) goto LAB_00155d04;
    if ((long)pcStack_180 < 0) goto LAB_00155d09;
    pcStack_1f0 = (code *)0x155bb8;
    uv_fs_req_cleanup(acStack_1d8);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_1f0 = (code *)0x155bda;
    uVar6 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_1e8 = 0;
    pcVar5 = (char *)0x0;
    pcStack_1f0 = (code *)0x155c0c;
    iov = uVar6;
    iVar1 = uv_fs_read(0,acStack_1d8,(ulong)pcVar3 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155d0e;
    if ((long)pcStack_180 < 0) goto LAB_00155d13;
    pcVar5 = buf;
    pcStack_1f0 = (code *)0x155c33;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155d18;
    pcStack_1f0 = (code *)0x155c50;
    uv_fs_close(loop,acStack_1d8,(ulong)pcVar3 & 0xffffffff,0);
    pcStack_1f0 = (code *)0x155c5e;
    uv_run(loop,0);
    pcStack_1f0 = (code *)0x155c6a;
    unlink("test_file");
    pcStack_1f0 = (code *)0x155c76;
    unlink("test_file_link");
    pcStack_1f0 = (code *)0x155c82;
    unlink("test_file_link2");
    pcStack_1f0 = (code *)0x155c87;
    pcVar3 = (char *)uv_default_loop();
    pcStack_1f0 = (code *)0x155c9b;
    uv_walk(pcVar3,close_walk_cb,0);
    pcStack_1f0 = (code *)0x155ca5;
    uv_run(pcVar3,0);
    pcStack_1f0 = (code *)0x155caa;
    pcVar5 = (char *)uv_default_loop();
    pcStack_1f0 = (code *)0x155cb2;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return;
    }
  }
  pcStack_1f0 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar5)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar5)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    pcStack_1f8 = (code *)0x155d41;
    link_cb_cold_1();
  }
  pcStack_1f8 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_1f8 = (code *)pcVar3;
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(loop,auStack_3b0,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_00155e3b;
    if (dummy_cb_count != 1) goto LAB_00155e40;
    if (lStack_350 != 0) goto LAB_00155e45;
    if (lStack_358 != -2) goto LAB_00155e4a;
    uv_fs_req_cleanup(auStack_3b0);
    iVar1 = uv_fs_readlink(0,auStack_3b0,"no_such_file",0);
    if (iVar1 != -2) goto LAB_00155e4f;
    if (lStack_350 != 0) goto LAB_00155e54;
    if (lStack_358 == -2) {
      uv_fs_req_cleanup(auStack_3b0);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00155e5e;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_00155e3b:
    run_test_fs_readlink_cold_2();
LAB_00155e40:
    run_test_fs_readlink_cold_3();
LAB_00155e45:
    run_test_fs_readlink_cold_4();
LAB_00155e4a:
    run_test_fs_readlink_cold_5();
LAB_00155e4f:
    run_test_fs_readlink_cold_6();
LAB_00155e54:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_00155e5e:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return;
}

Assistant:

static void fchown_cb(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_FCHOWN);
  ASSERT(req->result == 0);
  fchown_cb_count++;
  uv_fs_req_cleanup(req);
}